

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

void free_codes(archive_read *a)

{
  free(a->bidders[1].name);
  free(a->bidders[3].data);
  free(a->bidders[4].vtable);
  free(a->bidders[6].name);
  free(a->bidders[2].vtable);
  free(a->bidders[4].name);
  free(a->bidders[6].data);
  free(a->bidders[7].vtable);
  memset(&a->bidders[1].name,0,0xa0);
  return;
}

Assistant:

static void
free_codes(struct archive_read *a)
{
  struct rar *rar = (struct rar *)(a->format->data);
  free(rar->maincode.tree);
  free(rar->offsetcode.tree);
  free(rar->lowoffsetcode.tree);
  free(rar->lengthcode.tree);
  free(rar->maincode.table);
  free(rar->offsetcode.table);
  free(rar->lowoffsetcode.table);
  free(rar->lengthcode.table);
  memset(&rar->maincode, 0, sizeof(rar->maincode));
  memset(&rar->offsetcode, 0, sizeof(rar->offsetcode));
  memset(&rar->lowoffsetcode, 0, sizeof(rar->lowoffsetcode));
  memset(&rar->lengthcode, 0, sizeof(rar->lengthcode));
}